

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

string * __thiscall
cppcms::widgets::base_widget::id_abi_cxx11_(string *__return_storage_ptr__,base_widget *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->id_);
  return __return_storage_ptr__;
}

Assistant:

std::string base_widget::id()
{
	return id_;
}